

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,Formals *formals)

{
  bool bVar1;
  int iVar2;
  string local_d0;
  Symbol local_b0;
  string local_80;
  Symbol local_60;
  reference local_40;
  pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *formal;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  int index;
  Formals *formals_local;
  NewFunctionProcessingVisitor *this_local;
  
  iVar2 = FrameEmulator::GetFieldSize(&this->frame_);
  __range1._4_4_ = -iVar2;
  __end1 = std::
           vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&formals->formals_);
  formal = (pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&formals->formals_);
  while( true ) {
    __range1._4_4_ = __range1._4_4_ + -1;
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&formal);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
    std::__cxx11::string::string((string *)&local_80,(string *)&local_40->second);
    Symbol::Symbol(&local_60,&local_80);
    FunctionTable::CreateVariable(&this->table_,&local_60);
    Symbol::~Symbol(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_d0,(string *)&local_40->second);
    Symbol::Symbol(&local_b0,&local_d0);
    FunctionTable::Put(&this->table_,&local_b0,__range1._4_4_);
    Symbol::~Symbol(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    __gnu_cxx::
    __normal_iterator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(Formals* formals) {
  int index = -frame_.GetFieldSize() - 1;

  for (auto&& formal : formals->formals_) {
    table_.CreateVariable(Symbol(formal.second));
    table_.Put(Symbol(formal.second), index);
    --index;
  }
}